

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O1

void __thiscall KktChStep::makeKKTCheck(KktChStep *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> rD;
  vector<double,_std::allocator<double>_> cD;
  vector<double,_std::allocator<double>_> cV;
  KktCheck checker;
  vector<double,_std::allocator<double>_> local_218;
  vector<double,_std::allocator<double>_> local_1f8;
  vector<double,_std::allocator<double>_> local_1d8;
  KktCheck local_1c0;
  
  memset(&local_1c0.Astart,0,0x108);
  local_1c0.rIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c0.rIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c0.rIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0.cIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c0.cIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c0.cIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0.colValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c0.colValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0.colValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0.colDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c0.colDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0.colDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0.rowDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c0.rowDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0.rowDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resizeProblemMatrix(this,&local_1c0);
  KktCheck::setMatrix(&local_1c0,&this->Astart,&this->Aindex,&this->Avalue);
  KktCheck::setBounds(&local_1c0,&this->colUpper,&this->colLower);
  KktCheck::setNumbersCostRHS
            (&local_1c0,this->numCol,this->numRow,&this->rowLower,&this->rowUpper,&this->colCost);
  if (this->print != 0) {
    local_1c0.print = this->print;
  }
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&local_1d8,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize(&local_1f8,(long)this->numCol);
  iVar1 = this->RnumCol;
  if (0 < (long)iVar1) {
    piVar2 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar6 = 0;
    do {
      if (piVar2[lVar5] != 0) {
        local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = pdVar3[lVar5];
        local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = pdVar4[lVar5];
        iVar6 = iVar6 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  std::vector<double,_std::allocator<double>_>::resize(&local_218,(long)this->numRow);
  iVar1 = this->RnumRow;
  if (0 < (long)iVar1) {
    piVar2 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar6 = 0;
    do {
      if (piVar2[lVar5] != 0) {
        local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = pdVar3[lVar5];
        iVar6 = iVar6 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  KktCheck::passSolution(&local_1c0,&local_1d8,&local_1f8,&local_218);
  KktCheck::checkKKT(&local_1c0);
  if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  KktCheck::~KktCheck(&local_1c0);
  return;
}

Assistant:

void KktChStep::makeKKTCheck() {
	KktCheck checker;
	resizeProblemMatrix(checker);
	//KktCheck checker;
	checker.setMatrix(Astart, Aindex, Avalue);
	checker.setBounds(colUpper, colLower);
	checker.setNumbersCostRHS(numCol, numRow, rowLower, rowUpper, colCost);
	if (print) 	
		checker.print = print;
	
	//resize and pass solutions
	vector<double> cV;
    vector<double> cD;
    vector<double> rD;
    
    cV.resize(numCol);
    cD.resize(numCol);    
    
    int k=0;
    for (int i=0;i<RnumCol;i++)
    	if (flagCol[i]) {
    		cV[k]  = colValue[i];
    		cD[k] = colDual[i];
    		k++;
	    }
    
    rD.resize(numRow);
    k=0;
    for (int i=0;i<RnumRow;i++)
    	if (flagRow[i]) {
    		rD[k] = rowDual[i];
    		k++;
	    }
	
	
	
	checker.passSolution(cV, cD, rD);
	checker.checkKKT();
	}